

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnrealLoader.cpp
# Opt level: O0

void __thiscall Assimp::UnrealImporter::SetupProperties(UnrealImporter *this,Importer *pImp)

{
  uint32_t uVar1;
  int iVar2;
  Importer *pImp_local;
  UnrealImporter *this_local;
  
  uVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_UNREAL_KEYFRAME",-1);
  this->configFrameID = uVar1;
  if (this->configFrameID == 0xffffffff) {
    uVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_GLOBAL_KEYFRAME",0);
    this->configFrameID = uVar1;
  }
  iVar2 = Importer::GetPropertyInteger(pImp,"UNREAL_HANDLE_FLAGS",1);
  this->configHandleFlags = iVar2 != 0;
  return;
}

Assistant:

void UnrealImporter::SetupProperties(const Importer* pImp)
{
    // The
    // AI_CONFIG_IMPORT_UNREAL_KEYFRAME option overrides the
    // AI_CONFIG_IMPORT_GLOBAL_KEYFRAME option.
    configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_UNREAL_KEYFRAME,-1);
    if(static_cast<unsigned int>(-1) == configFrameID)  {
        configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_GLOBAL_KEYFRAME,0);
    }

    // AI_CONFIG_IMPORT_UNREAL_HANDLE_FLAGS, default is true
    configHandleFlags = (0 != pImp->GetPropertyInteger(AI_CONFIG_IMPORT_UNREAL_HANDLE_FLAGS,1));
}